

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_endpoint_refiner.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_endpoint_refiner::optimize_dxt5
          (dxt_endpoint_refiner *this,vec3F *low_color,vec3F *high_color)

{
  byte bVar1;
  ushort uVar2;
  params *ppVar3;
  color_quad_u8 *pcVar4;
  uint8 *puVar5;
  results *prVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ushort uVar24;
  int iVar25;
  bool bVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  uint64 DD [8];
  uint64 D2 [8];
  uint64 hist [8];
  uint values [8];
  uint16 solutions [529];
  ulong local_538 [28];
  undefined8 local_458;
  
  uVar13 = (uint)(low_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar13) {
    uVar13 = 0xff;
  }
  if ((int)uVar13 < 1) {
    uVar13 = 0;
  }
  uVar17 = (uint)(high_color->m_s[0] * 256.0);
  if (0xfe < (int)uVar17) {
    uVar17 = 0xff;
  }
  if ((int)uVar17 < 1) {
    uVar17 = 0;
  }
  local_538[0x16] = 0;
  local_538[0x17] = 0;
  local_538[0x14] = 0;
  local_538[0x15] = 0;
  local_538[0x12] = 0;
  local_538[0x13] = 0;
  local_538[0x10] = 0;
  local_538[0x11] = 0;
  local_538[0xe] = 0;
  local_538[0xf] = 0;
  local_538[0xc] = 0;
  local_538[0xd] = 0;
  local_538[10] = 0;
  local_538[0xb] = 0;
  local_538[8] = 0;
  local_538[9] = 0;
  local_538[6] = 0;
  local_538[7] = 0;
  local_538[4] = 0;
  local_538[5] = 0;
  local_538[2] = 0;
  local_538[3] = 0;
  local_538[0] = 0;
  local_538[1] = 0;
  ppVar3 = this->m_pParams;
  uVar14 = ppVar3->m_num_pixels;
  if ((ulong)uVar14 != 0) {
    uVar18 = ppVar3->m_alpha_comp_index;
    pcVar4 = ppVar3->m_pPixels;
    puVar5 = ppVar3->m_pSelectors;
    uVar21 = 0;
    do {
      bVar1 = pcVar4[uVar21].field_0.c[uVar18];
      uVar23 = (ulong)puVar5[uVar21];
      local_538[uVar23 + 0x10] = local_538[uVar23 + 0x10] + 1;
      local_538[uVar23 + 8] = local_538[uVar23 + 8] + (ulong)((uint)bVar1 + (uint)bVar1);
      local_538[uVar23] = local_538[uVar23] + (ulong)((uint)bVar1 * (uint)bVar1);
      uVar21 = uVar21 + 1;
    } while (uVar14 != uVar21);
  }
  uVar18 = uVar13 & 0xff;
  uVar14 = uVar17 & 0xff;
  local_458._0_2_ = (ushort)uVar18;
  if (uVar18 == uVar14) {
    if ((uVar13 & 0xff) == 0) {
      local_458._0_2_ = 1;
    }
    else {
      local_458._0_2_ = (ushort)local_458 * 0x101 - 0x100;
    }
  }
  else if (uVar14 < uVar18) {
    local_458._0_2_ = (ushort)(uVar14 << 8) | (ushort)local_458;
  }
  else {
    local_458._0_2_ = (ushort)local_458 * 0x100 + (short)uVar14;
  }
  uVar15 = uVar13 + 0xb & 0xff;
  if (0xf3 < uVar18) {
    uVar15 = 0xff;
  }
  uVar20 = uVar13 + 0xf5 & 0xff;
  if (uVar18 < 0xc) {
    uVar20 = 0;
  }
  uVar21 = 1;
  if (uVar20 <= uVar15) {
    uVar9 = uVar17 + 0xb & 0xff;
    if (0xf3 < uVar14) {
      uVar9 = 0xff;
    }
    uVar19 = uVar17 + 0xf5 & 0xff;
    if (uVar14 < 0xc) {
      uVar19 = 0;
    }
    uVar10 = uVar20;
    do {
      if (uVar19 <= uVar9) {
        uVar12 = (ushort)uVar10;
        uVar23 = uVar21;
        iVar25 = uVar19 << 8;
        uVar22 = uVar19;
        uVar2 = uVar12 * 0x100 - 0x100 | uVar12;
        if (uVar10 == 0) {
          uVar2 = 1;
        }
        do {
          uVar21 = uVar23;
          if (((uVar10 <= uVar22 || (uVar22 < uVar20 || uVar9 < uVar10)) &&
              (uVar17 != uVar22 || uVar18 != uVar10)) && (uVar13 != uVar22 || uVar14 != uVar10)) {
            uVar24 = uVar2;
            if (uVar10 != uVar22) {
              if (uVar22 < uVar10) {
                uVar24 = (ushort)iVar25 | uVar12;
              }
              else {
                uVar24 = uVar12 * 0x100 | (ushort)uVar22;
              }
            }
            uVar21 = (ulong)((int)uVar23 + 1);
            *(ushort *)((long)&local_458 + uVar23 * 2) = uVar24;
          }
          uVar22 = uVar22 + 1;
          uVar23 = uVar21;
          iVar25 = iVar25 + 0x100;
        } while (uVar9 + 1 != uVar22);
      }
      bVar26 = uVar10 != uVar15;
      uVar10 = uVar10 + 1;
    } while (bVar26);
    if ((int)uVar21 == 0) {
      return;
    }
  }
  uVar23 = 0;
  do {
    uVar2 = *(ushort *)((long)&local_458 + uVar23 * 2);
    dxt5_block::get_block_values8((uint *)(local_538 + 0x18),(uint)(byte)uVar2,(uint)(uVar2 >> 8));
    lVar16 = 0;
    lVar7 = 0;
    lVar8 = 0;
    do {
      uVar28 = *(ulong *)((long)&local_458 + (lVar16 * 2 + -0x10) * 2);
      uVar11 = uVar28 >> 0x20;
      uVar27 = (((local_538[lVar16 + 0x10] >> 0x20) * (uVar28 & 0xffffffff) << 0x20) +
               (local_538[lVar16 + 0x10] & 0xffffffff) * (uVar28 & 0xffffffff)) -
               local_538[lVar16 + 8];
      uVar29 = (((local_538[lVar16 + 0x11] >> 0x20) * uVar11 << 0x20) +
               (local_538[lVar16 + 0x11] & 0xffffffff) * uVar11) - local_538[lVar16 + 9];
      lVar7 = lVar7 + local_538[lVar16] + (uVar27 & 0xffffffff) * (uVar28 & 0xffffffff) +
              ((uVar27 >> 0x20) * (uVar28 & 0xffffffff) << 0x20);
      lVar8 = lVar8 + local_538[lVar16 + 1] + (uVar29 & 0xffffffff) * uVar11 +
              ((uVar29 >> 0x20) * uVar11 << 0x20);
      lVar16 = lVar16 + 2;
    } while (lVar16 != 8);
    uVar28 = lVar8 + lVar7;
    prVar6 = this->m_pResults;
    if (uVar28 < prVar6->m_error) {
      prVar6->m_low_color = uVar2 & 0xff;
      prVar6->m_high_color = uVar2 >> 8;
      prVar6->m_error = uVar28;
      if (uVar28 == 0) {
        return;
      }
    }
    uVar23 = uVar23 + 1;
  } while (uVar23 != uVar21);
  return;
}

Assistant:

void dxt_endpoint_refiner::optimize_dxt5(vec3F low_color, vec3F high_color)
    {
        uint8 L0 = math::clamp<int>(low_color[0] * 256.0f, 0, 255);
        uint8 H0 = math::clamp<int>(high_color[0] * 256.0f, 0, 255);

        uint64 hist[8] = {}, D2[8] = {}, DD[8] = {};
        for (uint c = m_pParams->m_alpha_comp_index, i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint8 a = m_pParams->m_pPixels[i][c];
            uint8 s = m_pParams->m_pSelectors[i];
            hist[s]++;
            D2[s] += a * 2;
            DD[s] += a * a;
        }

        uint16 solutions[529];
        uint solutions_count = 0;
        solutions[solutions_count++] = L0 == H0 ? H0 ? H0 - 1 << 8 | L0 : 1 : L0 > H0 ? H0 << 8 | L0
                                                                                      : L0 << 8 | H0;
        uint8 minL = L0 <= 11 ? 0 : L0 - 11, maxL = L0 >= 244 ? 255 : L0 + 11;
        uint8 minH = H0 <= 11 ? 0 : H0 - 11, maxH = H0 >= 244 ? 255 : H0 + 11;
        for (uint16 L = minL; L <= maxL; L++)
        {
            for (uint16 H = minH; H <= maxH; H++)
            {
                if ((maxH < L || L <= H || H < minL) && (L != L0 || H != H0) && (L != H0 || H != L0))
                {
                    solutions[solutions_count++] = L == H ? H ? H - 1 << 8 | L : 1 : L > H ? H << 8 | L
                                                                                           : L << 8 | H;
                }
            }
        }

        for (uint i = 0; i < solutions_count; i++)
        {
            uint8 L = solutions[i] & 0xFF;
            uint8 H = solutions[i] >> 8;
            uint values[8];
            dxt5_block::get_block_values8(values, L, H);
            uint64 error = 0;
            for (uint64 s = 0; s < 8; s++)
            {
                error += hist[s] * values[s] * values[s] - D2[s] * values[s] + DD[s];
            }
            if (error < m_pResults->m_error)
            {
                m_pResults->m_low_color = L;
                m_pResults->m_high_color = H;
                m_pResults->m_error = error;
                if (!m_pResults->m_error)
                {
                    return;
                }
            }
        }
    }